

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      *this,int i)

{
  long *plVar1;
  undefined2 uVar2;
  
  plVar1 = (long *)(this->stack_).stackTop_;
  if ((long)(this->stack_).stackEnd_ - (long)plVar1 < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    plVar1 = (long *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(plVar1 + 2);
  plVar1[1] = 0;
  *plVar1 = (long)i;
  uVar2 = 0xb6;
  if (-1 < i) {
    uVar2 = 0x1f6;
  }
  *(undefined2 *)((long)plVar1 + 0xe) = uVar2;
  return true;
}

Assistant:

bool Int(int i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }